

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O1

void leveldb::log::_Test_RandomRead::_RunIt(void)

{
  _Test_RandomRead t;
  LogTest LStack_98;
  
  LogTest::LogTest(&LStack_98);
  _Run((_Test_RandomRead *)&LStack_98);
  LogTest::~LogTest(&LStack_98);
  return;
}

Assistant:

TEST(LogTest, RandomRead) {
  const int N = 500;
  Random write_rnd(301);
  for (int i = 0; i < N; i++) {
    Write(RandomSkewedString(i, &write_rnd));
  }
  Random read_rnd(301);
  for (int i = 0; i < N; i++) {
    ASSERT_EQ(RandomSkewedString(i, &read_rnd), Read());
  }
  ASSERT_EQ("EOF", Read());
}